

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratio_tester_test.cc
# Opt level: O2

void __thiscall
fizplex::RatioTesterBounded_AlphaZeroAndNoUpperIsUnbounded_Test::TestBody
          (RatioTesterBounded_AlphaZeroAndNoUpperIsUnbounded_Test *this)

{
  char *message;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  AssertHelper local_48;
  AssertionResult gtest_ar;
  RatioTestResult res;
  
  RatioTester::ratio_test
            (&res,(RatioTester *)&(this->super_RatioTesterBounded).field_0xf0,
             &(this->super_RatioTesterBounded).lp,&(this->super_RatioTesterBounded).alpha,
             &(this->super_RatioTesterBounded).beta,(this->super_RatioTesterBounded).cind,
             &(this->super_RatioTesterBounded).basic,(this->super_RatioTesterBounded).ccost);
  local_50.ptr_._0_4_ = 0;
  testing::internal::
  CmpHelperEQ<fizplex::Simplex::IterationDecision,fizplex::Simplex::IterationDecision>
            ((internal *)&gtest_ar,"Simplex::IterationDecision::Unbounded","res.result",
             (IterationDecision *)&local_50,&res.result);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/ratio_tester_test.cc"
               ,0x17,message);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(RatioTesterBounded, AlphaZeroAndNoUpperIsUnbounded) {
  auto res = rt.ratio_test(lp, alpha, beta, cind, basic, ccost);
  EXPECT_EQ(Simplex::IterationDecision::Unbounded, res.result);
}